

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void M_AddVal(Matrix *M,size_t RoC,size_t Entry,Real Val)

{
  LASErrIdType LVar1;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((RoC == 0 || M->ElOrder != Rowws) || (M->RowDim < RoC)) &&
       ((M->ElOrder != Clmws || RoC == 0 || ((M->ClmDim < RoC || (M->Len[RoC] <= Entry)))))) {
      LASError(LASRangeErr,"M_AddVal",M->Name,(char *)0x0,(char *)0x0);
      return;
    }
    M->El[RoC][Entry].Val = Val + M->El[RoC][Entry].Val;
  }
  return;
}

Assistant:

void M_AddVal(Matrix *M, size_t RoC, size_t Entry, Real Val)
/* add a value to a matrix entry */
{
    if (LASResult() == LASOK) {
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC])))
            M->El[RoC][Entry].Val += Val;
        else
            LASError(LASRangeErr, "M_AddVal", M->Name, NULL, NULL);
    }
}